

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::CheckCompilerIdCompatibility(cmGlobalGenerator *this,cmMakefile *mf,string *lang)

{
  bool bVar1;
  int iVar2;
  PolicyStatus PVar3;
  ostream *poVar4;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  PolicyID id_02;
  bool local_552;
  bool local_4fa;
  string local_4d0;
  allocator local_4a9;
  string local_4a8;
  allocator local_481;
  string local_480;
  string local_460;
  string local_440;
  undefined1 local_420 [8];
  ostringstream w_1;
  allocator local_2a1;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  undefined1 local_220 [8];
  ostringstream w;
  allocator local_a1;
  string local_a0;
  undefined4 local_7c;
  char *local_78;
  char *compilerId;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string compilerIdVar;
  string *lang_local;
  cmMakefile *mf_local;
  cmGlobalGenerator *this_local;
  
  compilerIdVar.field_2._8_8_ = lang;
  std::operator+(&local_60,"CMAKE_",lang);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,"_COMPILER_ID");
  std::__cxx11::string::~string((string *)&local_60);
  local_78 = cmMakefile::GetDefinition(mf,(string *)local_40);
  if (local_78 == (char *)0x0) {
    local_7c = 1;
  }
  else {
    iVar2 = strcmp(local_78,"AppleClang");
    if (iVar2 == 0) {
      PVar3 = cmMakefile::GetPolicyStatus(mf,CMP0025);
      switch(PVar3) {
      case WARN:
        bVar1 = cmake::GetIsInTryCompile(this->CMakeInstance);
        local_4fa = false;
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_a0,"CMAKE_POLICY_WARNING_CMP0025",&local_a1)
          ;
          local_4fa = cmMakefile::PolicyOptionalWarningEnabled(mf,&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        }
        if (local_4fa != false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_240,(cmPolicies *)0x19,id_00);
          poVar4 = std::operator<<((ostream *)local_220,(string *)&local_240);
          poVar4 = std::operator<<(poVar4,"\nConverting ");
          poVar4 = std::operator<<(poVar4,(string *)compilerIdVar.field_2._8_8_);
          std::operator<<(poVar4," compiler id \"AppleClang\" to \"Clang\" for compatibility.");
          std::__cxx11::string::~string((string *)&local_240);
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_260);
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
        }
      case OLD:
        cmMakefile::AddDefinition(mf,(string *)local_40,"Clang");
        break;
      case REQUIRED_IF_USED:
      case REQUIRED_ALWAYS:
        cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_280,(cmPolicies *)0x19,id);
        cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_280);
        std::__cxx11::string::~string((string *)&local_280);
      case NEW:
      }
    }
    iVar2 = strcmp(local_78,"QCC");
    if (iVar2 == 0) {
      PVar3 = cmMakefile::GetPolicyStatus(mf,CMP0047);
      switch(PVar3) {
      case WARN:
        bVar1 = cmake::GetIsInTryCompile(this->CMakeInstance);
        local_552 = false;
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_2a0,"CMAKE_POLICY_WARNING_CMP0047",&local_2a1);
          local_552 = cmMakefile::PolicyOptionalWarningEnabled(mf,&local_2a0);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
        }
        if (local_552 != false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_420);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_440,(cmPolicies *)0x2f,id_02);
          poVar4 = std::operator<<((ostream *)local_420,(string *)&local_440);
          poVar4 = std::operator<<(poVar4,"\nConverting ");
          poVar4 = std::operator<<(poVar4,(string *)compilerIdVar.field_2._8_8_);
          std::operator<<(poVar4," compiler id \"QCC\" to \"GNU\" for compatibility.");
          std::__cxx11::string::~string((string *)&local_440);
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_460);
          std::__cxx11::string::~string((string *)&local_460);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_420);
        }
      case OLD:
        cmMakefile::AddDefinition(mf,(string *)local_40,"GNU");
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )compilerIdVar.field_2._8_8_,"C");
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_480,"CMAKE_COMPILER_IS_GNUCC",&local_481);
          cmMakefile::AddDefinition(mf,&local_480,"1");
          std::__cxx11::string::~string((string *)&local_480);
          std::allocator<char>::~allocator((allocator<char> *)&local_481);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)compilerIdVar.field_2._8_8_,"CXX");
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_4a8,"CMAKE_COMPILER_IS_GNUCXX",&local_4a9)
            ;
            cmMakefile::AddDefinition(mf,&local_4a8,"1");
            std::__cxx11::string::~string((string *)&local_4a8);
            std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
          }
        }
        break;
      case REQUIRED_IF_USED:
      case REQUIRED_ALWAYS:
        cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_4d0,(cmPolicies *)0x2f,id_01);
        cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_4d0);
        std::__cxx11::string::~string((string *)&local_4d0);
      case NEW:
      }
    }
    local_7c = 0;
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmGlobalGenerator::CheckCompilerIdCompatibility(cmMakefile* mf,
                                                std::string const& lang) const
{
  std::string compilerIdVar = "CMAKE_" + lang + "_COMPILER_ID";
  const char* compilerId = mf->GetDefinition(compilerIdVar);
  if(!compilerId)
    {
    return;
    }

  if(strcmp(compilerId, "AppleClang") == 0)
    {
    switch(mf->GetPolicyStatus(cmPolicies::CMP0025))
      {
      case cmPolicies::WARN:
        if(!this->CMakeInstance->GetIsInTryCompile() &&
           mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0025"))
          {
          std::ostringstream w;
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0025) << "\n"
            "Converting " << lang <<
            " compiler id \"AppleClang\" to \"Clang\" for compatibility."
            ;
          mf->IssueMessage(cmake::AUTHOR_WARNING, w.str());
          }
      case cmPolicies::OLD:
        // OLD behavior is to convert AppleClang to Clang.
        mf->AddDefinition(compilerIdVar, "Clang");
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          cmake::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0025)
          );
      case cmPolicies::NEW:
        // NEW behavior is to keep AppleClang.
        break;
      }
    }

  if(strcmp(compilerId, "QCC") == 0)
    {
    switch(mf->GetPolicyStatus(cmPolicies::CMP0047))
      {
      case cmPolicies::WARN:
        if(!this->CMakeInstance->GetIsInTryCompile() &&
           mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0047"))
          {
          std::ostringstream w;
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0047) << "\n"
            "Converting " << lang <<
            " compiler id \"QCC\" to \"GNU\" for compatibility."
            ;
          mf->IssueMessage(cmake::AUTHOR_WARNING, w.str());
          }
      case cmPolicies::OLD:
        // OLD behavior is to convert QCC to GNU.
        mf->AddDefinition(compilerIdVar, "GNU");
        if(lang == "C")
          {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCC", "1");
          }
        else if(lang == "CXX")
          {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCXX", "1");
          }
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          cmake::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0047)
          );
      case cmPolicies::NEW:
        // NEW behavior is to keep QCC.
        break;
      }
    }
}